

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getsockname.c
# Opt level: O1

int run_test_getsockname_tcp(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  uv_loop_t *tcp;
  void *pvVar3;
  ushort uVar4;
  code *in_RCX;
  char *pcVar5;
  char *pcVar6;
  uint port;
  undefined8 *extraout_RDX;
  uv_loop_t *unaff_RBX;
  uv_udp_t *puVar7;
  anon_union_16_2_bf76bca6_for_active_reqs *paVar8;
  code *pcVar9;
  uv_udp_t *puVar10;
  uv_udp_send_t *loop;
  uv_loop_t *unaff_R14;
  sockaddr sockname;
  sockaddr_in addr;
  sockaddr peername;
  undefined8 uStack_110;
  uchar auStack_108 [8];
  sockaddr_in sStack_100;
  char acStack_f0 [24];
  uv_loop_t *puStack_d8;
  int iStack_c4;
  undefined1 auStack_c0 [32];
  undefined1 auStack_a0 [16];
  anon_union_16_2_bf76bca6_for_active_reqs aStack_90;
  int iStack_7c;
  sockaddr_in sStack_78;
  uv_loop_t *puStack_68;
  uv_loop_t *puStack_60;
  int local_4c;
  sockaddr local_48;
  sockaddr_in local_30;
  sockaddr local_20;
  
  puStack_60 = (uv_loop_t *)0x159530;
  ::loop = uv_default_loop();
  puStack_60 = (uv_loop_t *)0x15954d;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&local_30);
  if (iVar1 == 0) {
    puStack_60 = (uv_loop_t *)0x159568;
    iVar1 = uv_tcp_init(::loop,&tcpServer);
    if (iVar1 != 0) {
      puStack_60 = (uv_loop_t *)0x15974d;
      run_test_getsockname_tcp_cold_2();
      return 1;
    }
    puStack_60 = (uv_loop_t *)0x159583;
    iVar1 = uv_tcp_bind(&tcpServer,(sockaddr *)&local_30,0);
    if (iVar1 != 0) {
      puStack_60 = (uv_loop_t *)0x159754;
      run_test_getsockname_tcp_cold_3();
      return 1;
    }
    puStack_60 = (uv_loop_t *)0x1595a3;
    iVar1 = uv_listen((uv_stream_t *)&tcpServer,0x80,on_connection);
    if (iVar1 != 0) {
      puStack_60 = (uv_loop_t *)0x15975b;
      run_test_getsockname_tcp_cold_4();
      return 1;
    }
    local_48.sa_family = 0xffff;
    local_48.sa_data[0] = -1;
    local_48.sa_data[1] = -1;
    local_48.sa_data[2] = -1;
    local_48.sa_data[3] = -1;
    local_48.sa_data[4] = -1;
    local_48.sa_data[5] = -1;
    local_48.sa_data[6] = -1;
    local_48.sa_data[7] = -1;
    local_48.sa_data[8] = -1;
    local_48.sa_data[9] = -1;
    local_48.sa_data[10] = -1;
    local_48.sa_data[0xb] = -1;
    local_48.sa_data[0xc] = -1;
    local_48.sa_data[0xd] = -1;
    local_4c = 0x10;
    puStack_60 = (uv_loop_t *)0x1595cf;
    iVar1 = uv_tcp_getsockname(&tcpServer,&local_48,&local_4c);
    if (iVar1 != 0) goto LAB_00159767;
    pcVar5 = "server socket";
    puStack_60 = (uv_loop_t *)0x1595f4;
    check_sockname(&local_48,"0.0.0.0",0x23a3,"server socket");
    getsocknamecount = getsocknamecount + 1;
    local_4c = 0x10;
    puStack_60 = (uv_loop_t *)0x159616;
    iVar1 = uv_tcp_getpeername(&tcpServer,&local_20,&local_4c);
    in_RCX = (code *)pcVar5;
    if (iVar1 != -0x6b) goto LAB_0015976c;
    getpeernamecount = getpeernamecount + 1;
    puStack_60 = (uv_loop_t *)0x15963b;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&local_30);
    in_RCX = (code *)pcVar5;
    if (iVar1 != 0) goto LAB_00159771;
    puStack_60 = (uv_loop_t *)0x159656;
    iVar1 = uv_tcp_init(::loop,&::tcp);
    ::tcp.data = &connect_req;
    in_RCX = (code *)&connect_req;
    if (iVar1 != 0) goto LAB_00159776;
    in_RCX = on_connect;
    puStack_60 = (uv_loop_t *)0x15968b;
    iVar1 = uv_tcp_connect(&connect_req,&::tcp,(sockaddr *)&local_30,on_connect);
    if (iVar1 != 0) goto LAB_0015977b;
    local_20.sa_family = 0x10;
    local_20.sa_data[0] = '\0';
    local_20.sa_data[1] = '\0';
    puStack_60 = (uv_loop_t *)0x1596af;
    iVar1 = uv_tcp_getsockname(&::tcp,&local_48,(int *)&local_20);
    if (iVar1 != 0) goto LAB_00159780;
    if (local_48.sa_family != 2) goto LAB_00159785;
    uVar4 = local_48.sa_data._0_2_ << 8 | (ushort)local_48.sa_data._0_2_ >> 8;
    in_RCX = (code *)(ulong)uVar4;
    connect_port = (int)uVar4;
    if (local_48.sa_data._0_2_ == 0) goto LAB_0015978a;
    puStack_60 = (uv_loop_t *)0x1596ee;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (getsocknamecount != 3) goto LAB_0015978f;
    if (getpeernamecount != 3) goto LAB_00159794;
    puStack_60 = (uv_loop_t *)0x15970d;
    unaff_R14 = uv_default_loop();
    unaff_RBX = (uv_loop_t *)0x0;
    puStack_60 = (uv_loop_t *)0x159723;
    uv_walk(unaff_R14,close_walk_cb,(void *)0x0);
    puStack_60 = (uv_loop_t *)0x15972d;
    uv_run(unaff_R14,UV_RUN_DEFAULT);
    puStack_60 = (uv_loop_t *)0x159732;
    puVar2 = uv_default_loop();
    puStack_60 = (uv_loop_t *)0x15973a;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    puStack_60 = (uv_loop_t *)0x159767;
    run_test_getsockname_tcp_cold_1();
LAB_00159767:
    puStack_60 = (uv_loop_t *)0x15976c;
    run_test_getsockname_tcp_cold_5();
LAB_0015976c:
    puStack_60 = (uv_loop_t *)0x159771;
    run_test_getsockname_tcp_cold_6();
LAB_00159771:
    puStack_60 = (uv_loop_t *)0x159776;
    run_test_getsockname_tcp_cold_7();
LAB_00159776:
    puStack_60 = (uv_loop_t *)0x15977b;
    run_test_getsockname_tcp_cold_8();
LAB_0015977b:
    puStack_60 = (uv_loop_t *)0x159780;
    run_test_getsockname_tcp_cold_9();
LAB_00159780:
    puStack_60 = (uv_loop_t *)0x159785;
    run_test_getsockname_tcp_cold_10();
LAB_00159785:
    puStack_60 = (uv_loop_t *)0x15978a;
    run_test_getsockname_tcp_cold_11();
LAB_0015978a:
    puStack_60 = (uv_loop_t *)0x15978f;
    run_test_getsockname_tcp_cold_15();
LAB_0015978f:
    puStack_60 = (uv_loop_t *)0x159794;
    run_test_getsockname_tcp_cold_12();
LAB_00159794:
    puStack_60 = (uv_loop_t *)0x159799;
    run_test_getsockname_tcp_cold_13();
  }
  puStack_60 = (uv_loop_t *)run_test_getsockname_udp;
  run_test_getsockname_tcp_cold_14();
  paVar8 = &aStack_90;
  auStack_a0._8_8_ = (void *)0x1597aa;
  puStack_68 = unaff_RBX;
  puStack_60 = unaff_R14;
  ::loop = uv_default_loop();
  pcVar5 = "0.0.0.0";
  puVar7 = (uv_udp_t *)0x23a3;
  auStack_a0._8_8_ = (void *)0x1597c7;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&sStack_78);
  if (iVar1 == 0) {
    auStack_a0._8_8_ = (void *)0x1597e2;
    iVar1 = uv_udp_init(::loop,&udpServer);
    if (iVar1 != 0) {
      auStack_a0._8_8_ = (void *)0x15996c;
      run_test_getsockname_udp_cold_2();
      return 1;
    }
    auStack_a0._8_8_ = (void *)0x1597fd;
    iVar1 = uv_udp_bind(&udpServer,(sockaddr *)&sStack_78,0);
    if (iVar1 != 0) {
      auStack_a0._8_8_ = (void *)0x159973;
      run_test_getsockname_udp_cold_3();
      return 1;
    }
    aStack_90._8_4_ = 0xffffffff;
    aStack_90.unused[0] = (void *)0xffffffffffffffff;
    aStack_90._12_4_ = 0xffffffff;
    iStack_7c = 0x10;
    puVar10 = &udpServer;
    auStack_a0._8_8_ = (void *)0x159827;
    iVar1 = uv_udp_getsockname(&udpServer,(sockaddr *)&aStack_90,&iStack_7c);
    pcVar6 = (char *)in_RCX;
    puVar7 = (uv_udp_t *)paVar8;
    loop = (uv_udp_send_t *)puVar10;
    if (iVar1 != 0) goto LAB_0015997f;
    pcVar6 = "udp listener socket";
    auStack_a0._8_8_ = (void *)0x15984a;
    check_sockname((sockaddr *)&aStack_90,"0.0.0.0",0x23a3,"udp listener socket");
    getsocknamecount = getsocknamecount + 1;
    puVar10 = &udpServer;
    pcVar9 = alloc;
    auStack_a0._8_8_ = (void *)0x15986a;
    iVar1 = uv_udp_recv_start(&udpServer,alloc,udp_recv);
    puVar7 = (uv_udp_t *)pcVar9;
    loop = (uv_udp_send_t *)puVar10;
    if (iVar1 != 0) goto LAB_00159984;
    puVar7 = &udp;
    auStack_a0._8_8_ = (void *)0x159885;
    loop = (uv_udp_send_t *)::loop;
    iVar1 = uv_udp_init(::loop,&udp);
    if (iVar1 != 0) goto LAB_00159989;
    auStack_a0._8_8_ = (void *)0x15989e;
    aStack_90 = (anon_union_16_2_bf76bca6_for_active_reqs)uv_buf_init("PING",4);
    loop = (uv_udp_send_t *)0x1a4b5a;
    puVar7 = (uv_udp_t *)0x23a3;
    auStack_a0._8_8_ = (void *)0x1598bd;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_78);
    if (iVar1 != 0) goto LAB_0015998e;
    loop = &send_req;
    puVar7 = &udp;
    pcVar6 = (char *)0x1;
    auStack_a0._8_8_ = (void *)0x1598ec;
    iVar1 = uv_udp_send(&send_req,&udp,(uv_buf_t *)&aStack_90,1,(sockaddr *)&sStack_78,udp_send);
    if (iVar1 != 0) goto LAB_00159993;
    puVar7 = (uv_udp_t *)0x0;
    auStack_a0._8_8_ = (void *)0x159902;
    loop = (uv_udp_send_t *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (getsocknamecount != 2) goto LAB_00159998;
    if (udp.send_queue_size != 0) goto LAB_0015999d;
    if (udpServer.send_queue_size != 0) goto LAB_001599a2;
    auStack_a0._8_8_ = (void *)0x15992c;
    unaff_R14 = uv_default_loop();
    unaff_RBX = (uv_loop_t *)0x0;
    auStack_a0._8_8_ = (void *)0x159942;
    uv_walk(unaff_R14,close_walk_cb,(void *)0x0);
    puVar7 = (uv_udp_t *)0x0;
    auStack_a0._8_8_ = (void *)0x15994c;
    uv_run(unaff_R14,UV_RUN_DEFAULT);
    auStack_a0._8_8_ = (void *)0x159951;
    loop = (uv_udp_send_t *)uv_default_loop();
    auStack_a0._8_8_ = (void *)0x159959;
    iVar1 = uv_loop_close((uv_loop_t *)loop);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    auStack_a0._8_8_ = (void *)0x15997f;
    run_test_getsockname_udp_cold_1();
    pcVar6 = (char *)in_RCX;
    loop = (uv_udp_send_t *)pcVar5;
LAB_0015997f:
    auStack_a0._8_8_ = (void *)0x159984;
    run_test_getsockname_udp_cold_4();
LAB_00159984:
    auStack_a0._8_8_ = (void *)0x159989;
    run_test_getsockname_udp_cold_5();
LAB_00159989:
    auStack_a0._8_8_ = (void *)0x15998e;
    run_test_getsockname_udp_cold_6();
LAB_0015998e:
    auStack_a0._8_8_ = (void *)0x159993;
    run_test_getsockname_udp_cold_7();
LAB_00159993:
    auStack_a0._8_8_ = (void *)0x159998;
    run_test_getsockname_udp_cold_8();
LAB_00159998:
    auStack_a0._8_8_ = (void *)0x15999d;
    run_test_getsockname_udp_cold_9();
LAB_0015999d:
    auStack_a0._8_8_ = (void *)0x1599a2;
    run_test_getsockname_udp_cold_10();
LAB_001599a2:
    auStack_a0._8_8_ = (void *)0x1599a7;
    run_test_getsockname_udp_cold_11();
  }
  auStack_a0._8_8_ = on_connection;
  run_test_getsockname_udp_cold_12();
  auStack_a0._0_8_ = unaff_RBX;
  auStack_a0._8_8_ = unaff_R14;
  if ((int)puVar7 == 0) {
    puVar2 = (uv_loop_t *)0xf8;
    tcp = (uv_loop_t *)malloc(0xf8);
    pcVar9 = (code *)puVar7;
    if (tcp == (uv_loop_t *)0x0) goto LAB_00159aad;
    pcVar9 = (code *)tcp;
    puVar2 = ::loop;
    iVar1 = uv_tcp_init(::loop,(uv_tcp_t *)tcp);
    unaff_RBX = tcp;
    if (iVar1 != 0) goto LAB_00159ab2;
    tcp->data = loop;
    pcVar9 = (code *)tcp;
    iVar1 = uv_accept((uv_stream_t *)loop,(uv_stream_t *)tcp);
    if (iVar1 != 0) goto LAB_00159ab7;
    iStack_c4 = 0x10;
    pcVar9 = (code *)(auStack_c0 + 0x10);
    loop = (uv_udp_send_t *)tcp;
    iVar1 = uv_tcp_getsockname((uv_tcp_t *)tcp,(sockaddr *)pcVar9,&iStack_c4);
    if (iVar1 != 0) goto LAB_00159abc;
    pcVar6 = "accepted socket";
    check_sockname((sockaddr *)(auStack_c0 + 0x10),"127.0.0.1",0x23a3,"accepted socket");
    getsocknamecount = getsocknamecount + 1;
    iStack_c4 = 0x10;
    pcVar9 = (code *)auStack_c0;
    loop = (uv_udp_send_t *)tcp;
    iVar1 = uv_tcp_getpeername((uv_tcp_t *)tcp,(sockaddr *)pcVar9,&iStack_c4);
    if (iVar1 != 0) goto LAB_00159ac1;
    pcVar6 = "accepted socket peer";
    check_sockname((sockaddr *)auStack_c0,"127.0.0.1",connect_port,"accepted socket peer");
    getpeernamecount = getpeernamecount + 1;
    pcVar9 = alloc;
    loop = (uv_udp_send_t *)tcp;
    iVar1 = uv_read_start((uv_stream_t *)tcp,alloc,after_read);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    puVar2 = (uv_loop_t *)((ulong)puVar7 & 0xffffffff);
    on_connection_cold_1();
    pcVar9 = (code *)puVar7;
LAB_00159aad:
    on_connection_cold_7();
LAB_00159ab2:
    loop = (uv_udp_send_t *)puVar2;
    on_connection_cold_2();
LAB_00159ab7:
    on_connection_cold_3();
LAB_00159abc:
    on_connection_cold_4();
LAB_00159ac1:
    on_connection_cold_5();
  }
  on_connection_cold_6();
  uStack_110 = ((uv_loop_t *)loop)->data;
  auStack_108 = *(uchar (*) [8])&((uv_loop_t *)loop)->active_handles;
  pcVar5 = (char *)(ulong)port;
  puStack_d8 = unaff_RBX;
  iVar1 = uv_ip4_addr((char *)pcVar9,port,&sStack_100);
  if (iVar1 == 0) {
    if ((sa_family_t)uStack_110 != 2) goto LAB_00159b5d;
    if (sStack_100.sin_family != 2) goto LAB_00159b62;
    if (uStack_110._4_4_ != sStack_100.sin_addr.s_addr) goto LAB_00159b67;
    if ((port != 0) && (uStack_110._2_2_ != sStack_100.sin_port)) goto LAB_00159b71;
    pcVar5 = acStack_f0;
    iVar1 = uv_ip4_name((sockaddr_in *)&uStack_110,pcVar5,0x11);
    if (iVar1 == 0) {
      iVar1 = printf("%s: %s:%d\n",pcVar6,acStack_f0,
                     (ulong)(ushort)(uStack_110._2_2_ << 8 | uStack_110._2_2_ >> 8));
      return iVar1;
    }
  }
  else {
    check_sockname_cold_1();
LAB_00159b5d:
    check_sockname_cold_2();
LAB_00159b62:
    check_sockname_cold_3();
LAB_00159b67:
    check_sockname_cold_4();
  }
  check_sockname_cold_6();
LAB_00159b71:
  check_sockname_cold_5();
  pvVar3 = malloc((size_t)pcVar5);
  *extraout_RDX = pvVar3;
  extraout_RDX[1] = pcVar5;
  return (int)pvVar3;
}

Assistant:

TEST_IMPL(getsockname_tcp) {
  loop = uv_default_loop();

  if (tcp_listener())
    return 1;

  tcp_connector();

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(getsocknamecount == 3);
  ASSERT(getpeernamecount == 3);

  MAKE_VALGRIND_HAPPY();
  return 0;
}